

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

lua_Number luaL_optnumber(lua_State *L,int idx,lua_Number def)

{
  TValue TVar1;
  int iVar2;
  TValue *pTVar3;
  TValue TVar4;
  TValue tmp;
  
  pTVar3 = index2adr(L,idx);
  TVar1 = (TValue)pTVar3->it64;
  TVar4 = TVar1;
  if (((0xfffffffffffffff2 < (ulong)(TVar1.it64 >> 0x2f)) &&
      (TVar4.n = def, (lua_Number)TVar1.u64 != -NAN)) &&
     ((TVar1.it64 >> 0x2f != 0xfffffffffffffffb ||
      (iVar2 = lj_strscan_num((GCstr *)(TVar1.u64 & 0x7fffffffffff),&tmp), TVar4 = tmp, iVar2 == 0))
     )) {
    lj_err_argt(L,idx,3);
  }
  return TVar4.n;
}

Assistant:

LUALIB_API lua_Number luaL_optnumber(lua_State *L, int idx, lua_Number def)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  if (LJ_LIKELY(tvisnumber(o)))
    return numberVnum(o);
  else if (tvisnil(o))
    return def;
  else if (!(tvisstr(o) && lj_strscan_num(strV(o), &tmp)))
    lj_err_argt(L, idx, LUA_TNUMBER);
  return numV(&tmp);
}